

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::BinaryOperator::BinaryOperator
          (BinaryOperator *this,Context *c,Expression *a,Expression *b,Op op)

{
  bool bVar1;
  Expression *pEVar2;
  bool local_3d;
  Op op_local;
  Expression *b_local;
  Expression *a_local;
  Context *c_local;
  BinaryOperator *this_local;
  
  Expression::Expression(&this->super_Expression,BinaryOperator,c,value);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__BinaryOperator_0063be70;
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&this->lhs,a);
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&this->rhs,b);
  this->operation = op;
  TypeRules::BinaryOperatorTypes::BinaryOperatorTypes(&this->resolvedOpTypes);
  pEVar2 = pool_ref<soul::AST::Expression>::get(&this->lhs);
  bVar1 = isPossiblyValue(pEVar2);
  local_3d = false;
  if (bVar1) {
    pEVar2 = pool_ref<soul::AST::Expression>::get(&this->rhs);
    local_3d = isPossiblyValue(pEVar2);
  }
  checkAssertion(local_3d,"isPossiblyValue (lhs.get()) && isPossiblyValue (rhs.get())",
                 "BinaryOperator",0x91e);
  return;
}

Assistant:

BinaryOperator (const Context& c, Expression& a, Expression& b, BinaryOp::Op op)
           : Expression (ObjectType::BinaryOperator, c, ExpressionKind::value), lhs (a), rhs (b), operation (op)
        {
            SOUL_ASSERT (isPossiblyValue (lhs.get()) && isPossiblyValue (rhs.get()));
        }